

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O3

void __thiscall
fmt::v11::detail::parse_format_string<char,fmt::v11::detail::format_string_checker<char,2,0,false>>
          (detail *this,basic_string_view<char> fmt,
          format_string_checker<char,_2,_0,_false> *handler)

{
  compile_parse_context<char> *this_00;
  size_t *psVar1;
  detail dVar2;
  char *pcVar3;
  detail *pdVar4;
  uint uVar5;
  detail *begin;
  format_string_checker<char,_2,_0,_false> *pfVar6;
  detail *end;
  id_adapter local_40;
  
  pfVar6 = (format_string_checker<char,_2,_0,_false> *)fmt.size_;
  if (fmt.data_ != (char *)0x0) {
    end = (detail *)(fmt.data_ + (long)this);
    this_00 = &pfVar6->context_;
    do {
      begin = this + 1;
      if (*this == (detail)0x7d) {
        if ((begin == end) || (*begin != (detail)0x7d)) {
          report_error("unmatched \'}\' in format string");
        }
        goto LAB_0015cc36;
      }
      if (*this == (detail)0x7b) {
        if (begin == end) {
          report_error("invalid format string");
        }
        dVar2 = *begin;
        if (dVar2 == (detail)0x3a) {
          uVar5 = compile_parse_context<char>::next_arg_id(this_00);
LAB_0015cca7:
          begin = begin + 1;
          pcVar3 = (pfVar6->context_).super_parse_context<char>.fmt_.data_;
          (pfVar6->context_).super_parse_context<char>.fmt_.data_ = (char *)begin;
          psVar1 = &(pfVar6->context_).super_parse_context<char>.fmt_.size_;
          *psVar1 = (size_t)(pcVar3 + (*psVar1 - (long)begin));
          pdVar4 = begin;
          if (uVar5 < 2) {
            begin = (detail *)(*pfVar6->parse_funcs_[uVar5])(&this_00->super_parse_context<char>);
          }
          else {
            for (; (pdVar4 != end && (begin = pdVar4, *pdVar4 != (detail)0x7d)); pdVar4 = pdVar4 + 1
                ) {
              begin = end;
            }
          }
          if ((begin == end) || (*begin != (detail)0x7d)) {
            report_error("unknown format specifier");
          }
LAB_0015ccef:
          begin = begin + 1;
        }
        else {
          if (dVar2 != (detail)0x7b) {
            if (dVar2 != (detail)0x7d) {
              local_40.arg_id = 0;
              local_40.handler = pfVar6;
              begin = (detail *)
                      parse_arg_id<char,fmt::v11::detail::parse_replacement_field<char,fmt::v11::detail::format_string_checker<char,2,0,false>&>(char_const*,char_const*,fmt::v11::detail::format_string_checker<char,2,0,false>&)::id_adapter&>
                                ((char *)begin,(char *)end,&local_40);
              if (begin == end) {
LAB_0015cd31:
                report_error("missing \'}\' in format string");
              }
              uVar5 = local_40.arg_id;
              if (*begin == (detail)0x3a) goto LAB_0015cca7;
              if (*begin != (detail)0x7d) goto LAB_0015cd31;
              pcVar3 = (pfVar6->context_).super_parse_context<char>.fmt_.data_;
              (pfVar6->context_).super_parse_context<char>.fmt_.data_ = (char *)begin;
              psVar1 = &(pfVar6->context_).super_parse_context<char>.fmt_.size_;
              *psVar1 = (size_t)(pcVar3 + (*psVar1 - (long)begin));
              if ((uint)local_40.arg_id < 2) {
                (*pfVar6->parse_funcs_[(uint)local_40.arg_id])(&this_00->super_parse_context<char>);
              }
              goto LAB_0015ccef;
            }
            uVar5 = compile_parse_context<char>::next_arg_id(this_00);
            pcVar3 = (pfVar6->context_).super_parse_context<char>.fmt_.data_;
            (pfVar6->context_).super_parse_context<char>.fmt_.data_ = (char *)begin;
            psVar1 = &(pfVar6->context_).super_parse_context<char>.fmt_.size_;
            *psVar1 = (size_t)(pcVar3 + (*psVar1 - (long)begin));
            if (uVar5 < 2) {
              (*pfVar6->parse_funcs_[uVar5])(&this_00->super_parse_context<char>);
            }
          }
LAB_0015cc36:
          begin = this + 2;
        }
      }
      this = begin;
    } while (this != end);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void parse_format_string(basic_string_view<Char> fmt,
                                       Handler&& handler) {
  auto begin = fmt.data(), end = begin + fmt.size();
  auto p = begin;
  while (p != end) {
    auto c = *p++;
    if (c == '{') {
      handler.on_text(begin, p - 1);
      begin = p = parse_replacement_field(p - 1, end, handler);
    } else if (c == '}') {
      if (p == end || *p != '}')
        return handler.on_error("unmatched '}' in format string");
      handler.on_text(begin, p);
      begin = ++p;
    }
  }
  handler.on_text(begin, end);
}